

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QuadraticCost.cpp
# Opt level: O0

bool __thiscall
iDynTree::optimalcontrol::QuadraticCost::setStateCost
          (QuadraticCost *this,
          shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::MatrixDynSize>_>
          *timeVaryingStateHessian,
          shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>_>
          *timeVaryingStateGradient)

{
  bool bVar1;
  __shared_ptr *in_RDX;
  __shared_ptr *in_RSI;
  shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::MatrixDynSize>_>
  *in_stack_ffffffffffffffb8;
  bool local_1;
  
  bVar1 = std::__shared_ptr::operator_cast_to_bool(in_RSI);
  if (bVar1) {
    bVar1 = std::__shared_ptr::operator_cast_to_bool(in_RDX);
    if (bVar1) {
      std::shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::MatrixDynSize>_>::
      operator=((shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::MatrixDynSize>_> *
                )in_RSI,in_stack_ffffffffffffffb8);
      std::shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>_>::
      operator=((shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>_> *
                )in_RSI,(shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>_>
                         *)in_stack_ffffffffffffffb8);
      local_1 = true;
    }
    else {
      iDynTree::reportError("QuadraticCost","setStateCost","Empty gradient pointer.");
      local_1 = false;
    }
  }
  else {
    iDynTree::reportError("QuadraticCost","setStateCost","Empty hessian pointer.");
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool QuadraticCost::setStateCost(std::shared_ptr<TimeVaryingMatrix> timeVaryingStateHessian, std::shared_ptr<TimeVaryingVector> timeVaryingStateGradient)
        {
            if (!timeVaryingStateHessian) {
                reportError("QuadraticCost", "setStateCost", "Empty hessian pointer.");
                return false;
            }

            if (!timeVaryingStateGradient) {
                reportError("QuadraticCost", "setStateCost", "Empty gradient pointer.");
                return false;
            }

            m_timeVaryingStateHessian = timeVaryingStateHessian;
            m_timeVaryingStateGradient = timeVaryingStateGradient;

            return true;
        }